

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::MakeProtoProtoPathRelative
          (CommandLineInterface *this,DiskSourceTree *source_tree,string *proto,
          DescriptorDatabase *fallback_database)

{
  byte bVar1;
  bool bVar2;
  DiskFileToVirtualFileResult DVar4;
  ostream *poVar5;
  char *pcVar6;
  int *piVar7;
  byte bVar8;
  string virtual_file;
  string shadowing_disk_file;
  string disk_file_1;
  FileDescriptorProto fallback_file;
  int iVar3;
  
  FileDescriptorProto::FileDescriptorProto(&fallback_file);
  if (fallback_database == (DescriptorDatabase *)0x0) {
    bVar1 = 0;
  }
  else {
    iVar3 = (*fallback_database->_vptr_DescriptorDatabase[2])
                      (fallback_database,proto,&fallback_file);
    bVar1 = (byte)iVar3;
  }
  iVar3 = access((proto->_M_dataplus)._M_p,0);
  if (iVar3 < 0) {
    virtual_file._M_dataplus._M_p = (pointer)&virtual_file.field_2;
    virtual_file._M_string_length = 0;
    virtual_file.field_2._M_local_buf[0] = '\0';
    bVar2 = DiskSourceTree::VirtualFileToDiskFile(source_tree,proto,&virtual_file);
    bVar8 = bVar1 | bVar2;
    if (bVar8 == 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,(string *)proto);
      poVar5 = std::operator<<(poVar5,": ");
      pcVar6 = strerror(2);
      poVar5 = std::operator<<(poVar5,pcVar6);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    std::__cxx11::string::~string((string *)&virtual_file);
    goto LAB_0026d66d;
  }
  virtual_file._M_dataplus._M_p = (pointer)&virtual_file.field_2;
  virtual_file._M_string_length = 0;
  virtual_file.field_2._M_local_buf[0] = '\0';
  shadowing_disk_file._M_dataplus._M_p = (pointer)&shadowing_disk_file.field_2;
  shadowing_disk_file._M_string_length = 0;
  shadowing_disk_file.field_2._M_local_buf[0] = '\0';
  DVar4 = DiskSourceTree::DiskFileToVirtualFile
                    (source_tree,proto,&virtual_file,&shadowing_disk_file);
  bVar8 = 1;
  switch(DVar4) {
  case SUCCESS:
    std::__cxx11::string::_M_assign((string *)proto);
    break;
  case SHADOWED:
    poVar5 = std::operator<<((ostream *)&std::cerr,(string *)proto);
    poVar5 = std::operator<<(poVar5,": Input is shadowed in the --proto_path by \"");
    poVar5 = std::operator<<(poVar5,(string *)&shadowing_disk_file);
    poVar5 = std::operator<<(poVar5,
                             "\".  Either use the latter file as your input or reorder the --proto_path so that the former file\'s location comes first."
                            );
LAB_0026d64f:
    std::endl<char,std::char_traits<char>>(poVar5);
    bVar8 = 0;
    break;
  case CANNOT_OPEN:
    if (bVar1 == 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,(string *)proto);
      poVar5 = std::operator<<(poVar5,": ");
      piVar7 = __errno_location();
      pcVar6 = strerror(*piVar7);
      poVar5 = std::operator<<(poVar5,pcVar6);
      goto LAB_0026d64f;
    }
    break;
  case NO_MAPPING:
    disk_file_1._M_dataplus._M_p = (pointer)&disk_file_1.field_2;
    disk_file_1._M_string_length = 0;
    disk_file_1.field_2._M_local_buf[0] = '\0';
    bVar2 = DiskSourceTree::VirtualFileToDiskFile(source_tree,proto,&disk_file_1);
    bVar8 = bVar1 | bVar2;
    if (bVar8 == 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,(string *)proto);
      poVar5 = std::operator<<(poVar5,
                               ": File does not reside within any path specified using --proto_path (or -I).  You must specify a --proto_path which encompasses this file.  Note that the proto_path must be an exact prefix of the .proto file names -- protoc is too dumb to figure out when two paths (e.g. absolute and relative) are equivalent (it\'s harder than you think)."
                              );
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    std::__cxx11::string::~string((string *)&disk_file_1);
  }
  std::__cxx11::string::~string((string *)&shadowing_disk_file);
  std::__cxx11::string::~string((string *)&virtual_file);
LAB_0026d66d:
  FileDescriptorProto::~FileDescriptorProto(&fallback_file);
  return (bool)bVar8;
}

Assistant:

bool CommandLineInterface::MakeProtoProtoPathRelative(
    DiskSourceTree* source_tree, std::string* proto,
    DescriptorDatabase* fallback_database) {
  // If it's in the fallback db, don't report non-existent file errors.
  FileDescriptorProto fallback_file;
  bool in_fallback_database =
      fallback_database != nullptr &&
      fallback_database->FindFileByName(*proto, &fallback_file);

  // If the input file path is not a physical file path, it must be a virtual
  // path.
  if (access(proto->c_str(), F_OK) < 0) {
    std::string disk_file;
    if (source_tree->VirtualFileToDiskFile(*proto, &disk_file) ||
        in_fallback_database) {
      return true;
    } else {
      std::cerr << *proto << ": " << strerror(ENOENT) << std::endl;
      return false;
    }
  }

  std::string virtual_file, shadowing_disk_file;
  switch (source_tree->DiskFileToVirtualFile(*proto, &virtual_file,
                                             &shadowing_disk_file)) {
    case DiskSourceTree::SUCCESS:
      *proto = virtual_file;
      break;
    case DiskSourceTree::SHADOWED:
      std::cerr << *proto << ": Input is shadowed in the --proto_path by \""
                << shadowing_disk_file
                << "\".  Either use the latter file as your input or reorder "
                   "the --proto_path so that the former file's location "
                   "comes first."
                << std::endl;
      return false;
    case DiskSourceTree::CANNOT_OPEN:
      if (in_fallback_database) {
        return true;
      }
      std::cerr << *proto << ": " << strerror(errno) << std::endl;
      return false;
    case DiskSourceTree::NO_MAPPING: {
      // Try to interpret the path as a virtual path.
      std::string disk_file;
      if (source_tree->VirtualFileToDiskFile(*proto, &disk_file) ||
          in_fallback_database) {
        return true;
      } else {
        // The input file path can't be mapped to any --proto_path and it also
        // can't be interpreted as a virtual path.
        std::cerr
            << *proto
            << ": File does not reside within any path "
               "specified using --proto_path (or -I).  You must specify a "
               "--proto_path which encompasses this file.  Note that the "
               "proto_path must be an exact prefix of the .proto file "
               "names -- protoc is too dumb to figure out when two paths "
               "(e.g. absolute and relative) are equivalent (it's harder "
               "than you think)."
            << std::endl;
        return false;
      }
    }
  }
  return true;
}